

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_DestroyFontsTexture(void)

{
  ImGuiIO *pIVar1;
  ImGui_ImplOpenGL3_Data *pIVar2;
  
  pIVar1 = ImGui::GetIO();
  pIVar2 = ImGui_ImplOpenGL3_GetBackendData();
  if (pIVar2->FontTexture != 0) {
    (*imgl3wProcs.ptr[0x13])(1,&pIVar2->FontTexture);
    pIVar1->Fonts->TexID = (ImTextureID)0x0;
    pIVar2->FontTexture = 0;
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL3_DestroyFontsTexture()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();
    if (bd->FontTexture)
    {
        glDeleteTextures(1, &bd->FontTexture);
        io.Fonts->SetTexID(0);
        bd->FontTexture = 0;
    }
}